

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
libtorrent::(anonymous_namespace)::get_file_attrs_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,file_flags_t flags,
          bool include_symlinks)

{
  char cVar1;
  string attr;
  
  if (((ulong)this & 0xf) == 0) {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  else {
    attr._M_dataplus._M_p = (pointer)&attr.field_2;
    attr._M_string_length = 0;
    attr.field_2._M_local_buf[0] = '\0';
    cVar1 = (char)&attr;
    if (((ulong)this & 1) != 0) {
      ::std::__cxx11::string::push_back(cVar1);
    }
    if (((ulong)this & 2) != 0) {
      ::std::__cxx11::string::push_back(cVar1);
    }
    if (((ulong)this & 4) != 0) {
      ::std::__cxx11::string::push_back(cVar1);
    }
    if (flags.m_val == '\x01' && ((ulong)this & 8) != 0) {
      ::std::__cxx11::string::push_back(cVar1);
    }
    ::std::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&attr);
    ::std::__cxx11::string::~string((string *)&attr);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> get_file_attrs(file_flags_t const flags, bool const include_symlinks)
	{
		if (!(flags & (file_storage::flag_pad_file
			| file_storage::flag_hidden
			| file_storage::flag_executable
			| file_storage::flag_symlink)))
		{
			return std::nullopt;
		}
		std::string attr;
		if (flags & file_storage::flag_pad_file) attr += 'p';
		if (flags & file_storage::flag_hidden) attr += 'h';
		if (flags & file_storage::flag_executable) attr += 'x';
		if (include_symlinks && (flags & file_storage::flag_symlink)) attr += 'l';
		return attr;
	}